

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_remote.c
# Opt level: O0

int remote_infile(mpt_out_data *od)

{
  mpt_buffer *info;
  mpt_stream *srm;
  mpt_out_data *od_local;
  
  if ((od->con).out.sock._id < 0) {
    info = (od->con).out.buf._buf;
    if (info == (mpt_buffer *)0x0) {
      od_local._4_4_ = -1;
    }
    else {
      od_local._4_4_ = _mpt_stream_fread((mpt_streaminfo *)info);
    }
  }
  else {
    od_local._4_4_ = (od->con).out.sock._id;
  }
  return od_local._4_4_;
}

Assistant:

static int remote_infile(const MPT_STRUCT(out_data) *od)
{
	MPT_STRUCT(stream) *srm;
	if (MPT_socket_active(&od->con.out.sock)) {
		return od->con.out.sock._id;
	}
	if (!(srm = (void *) od->con.out.buf._buf)) {
		return -1;
	}
	return _mpt_stream_fread(&srm->_info);
}